

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateHandleForwardDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b0;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_179;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  undefined1 local_130 [64];
  string local_f0;
  reference local_d0;
  ExtensionData *extension;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  *__range1_1;
  reference local_90;
  FeatureData *feature;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  *__range1;
  string forwardDeclarations;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string fowardDeclarationsTemplate;
  VulkanHppGenerator *this_local;
  
  fowardDeclarationsTemplate.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,
             "\n  //===================================\n  //=== HANDLE forward declarations ===\n  //===================================\n\n${forwardDeclarations}\n"
             ,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ::begin(&this->m_features);
  feature = (FeatureData *)
            std::
            vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
            ::end(&this->m_features);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
                      (&__end1,(__normal_iterator<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
                                *)&feature);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_90 = __gnu_cxx::
               __normal_iterator<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
               ::operator*(&__end1);
    generateHandleForwardDeclarations
              ((string *)&__range1_1,this,&local_90->requireData,&local_90->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1);
    std::__cxx11::string::~string((string *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::FeatureData_*,_std::vector<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
             ::begin(&this->m_extensions);
  extension = (ExtensionData *)
              std::
              vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
              ::end(&this->m_extensions);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
                      (&__end1_1,
                       (__normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
                        *)&extension);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_d0 = __gnu_cxx::
               __normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
               ::operator*(&__end1_1);
    generateHandleForwardDeclarations(&local_f0,this,&local_d0->requireData,&local_d0->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
               &local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::ExtensionData_*,_std::vector<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>_>
    ::operator++(&__end1_1);
  }
  local_178 = &local_170;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (local_178,(char (*) [20])"forwardDeclarations",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
  local_130._0_8_ = &local_170;
  local_130._8_8_ = 1;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_17a);
  __l._M_len = local_130._8_8_;
  __l._M_array = (iterator)local_130._0_8_;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)(local_130 + 0x10),__l,&local_179,&local_17a);
  replaceWithMap(__return_storage_ptr__,(string *)local_38,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_130 + 0x10));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(local_130 + 0x10));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_17a);
  local_1b0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_130;
  do {
    local_1b0 = local_1b0 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_1b0);
  } while (local_1b0 != &local_170);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateHandleForwardDeclarations() const
{
  const std::string fowardDeclarationsTemplate = R"(
  //===================================
  //=== HANDLE forward declarations ===
  //===================================

${forwardDeclarations}
)";

  std::string forwardDeclarations;
  for ( auto const & feature : m_features )
  {
    forwardDeclarations += generateHandleForwardDeclarations( feature.requireData, feature.name );
  }
  for ( auto const & extension : m_extensions )
  {
    forwardDeclarations += generateHandleForwardDeclarations( extension.requireData, extension.name );
  }

  return replaceWithMap( fowardDeclarationsTemplate, { { "forwardDeclarations", forwardDeclarations } } );
}